

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QPoint __thiscall QWidget::mapFrom(QWidget *this,QWidget *parent,QPoint *pos)

{
  bool bVar1;
  QPoint QVar2;
  long in_FS_OFFSET;
  double dVar3;
  QPointF QVar4;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.xp = (qreal)(*pos).xp.m_i;
  local_18.yp = (qreal)(*pos).yp.m_i;
  QVar4 = mapFrom(this,parent,&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    dVar3 = (double)((ulong)QVar4.xp & 0x8000000000000000 | 0x3fe0000000000000) + QVar4.xp;
    bVar1 = 2147483647.0 < dVar3;
    if (dVar3 <= -2147483648.0) {
      dVar3 = -2147483648.0;
    }
    QVar2.xp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3)
    ;
    dVar3 = (double)((ulong)QVar4.yp & 0x8000000000000000 | 0x3fe0000000000000) + QVar4.yp;
    bVar1 = 2147483647.0 < dVar3;
    if (dVar3 <= -2147483648.0) {
      dVar3 = -2147483648.0;
    }
    QVar2.yp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar3)
    ;
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QPoint QWidget::mapFrom(const QWidget *parent, const QPoint &pos) const
{
    return mapFrom(parent, QPointF(pos)).toPoint();
}